

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O1

void testMultiPartSharedAttributes(string *tempDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  pointer pHVar5;
  pointer pHVar6;
  _Alloc_hider _Var7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  int *piVar12;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *__x;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *this;
  ulong *puVar13;
  long *plVar14;
  float *pfVar15;
  Attribute *pAVar16;
  size_type *psVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  Header header;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  size_type __dnew;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers_1;
  TimeCodeAttribute tta;
  string fn;
  TimeCode t;
  TimeCodeAttribute ta;
  vector<Imf_3_4::TypedAttribute<float>,_std::allocator<Imf_3_4::TypedAttribute<float>_>_> ifa;
  TimeCodeAttribute ta_1;
  stringstream ss;
  TimeCode t_1;
  string local_320;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_2e8;
  string local_2d0;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_298;
  int local_26c;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_268;
  string local_248;
  size_type local_228 [4];
  string local_208 [2];
  string local_1c0 [4];
  ios_base local_140 [272];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing multi part APIs : shared attributes, header... ",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  random_reseed(1);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  pcVar4 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar4,pcVar4 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (Header *)0x0;
  local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar18 = 0;
  do {
    local_1c0[0]._M_dataplus._M_p = (pointer)0x0;
    Imf_3_4::Header::Header
              ((Header *)&local_320,0xc5,0x107,1.0,(Vec2 *)local_1c0,1.0,INCREASING_Y,
               ZIP_COMPRESSION);
    iVar8 = random_int(3);
    iVar9 = random_int(2);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1c0);
    std::ostream::operator<<(&local_1c0[0].field_2,iVar18);
    std::__cxx11::stringbuf::str();
    Imf_3_4::Header::setName((string *)&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (iVar8 == 0) {
      pcVar11 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&local_2d0,UINT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"UINT");
    }
    else if (iVar8 == 1) {
      pcVar11 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&local_2d0,FLOAT,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"FLOAT");
    }
    else if (iVar8 == 2) {
      pcVar11 = (char *)Imf_3_4::Header::channels();
      Imf_3_4::Channel::Channel((Channel *)&local_2d0,HALF,1,1,false);
      Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"HALF");
    }
    if (((iVar9 == 0) || (iVar9 == 1)) &&
       (Imf_3_4::Header::setType((string *)&local_320), iVar9 == 1)) {
      iVar8 = random_int(0xc5);
      iVar9 = random_int(0x107);
      uVar10 = random_int(3);
      if (2 < uVar10) {
        uVar10 = 3;
      }
      local_2d0._M_dataplus._M_p._4_4_ = iVar9 + 1;
      local_2d0._M_dataplus._M_p._0_4_ = iVar8 + 1;
      local_2d0._M_string_length = (size_type)uVar10;
      Imf_3_4::Header::setTileDescription((TileDescription *)&local_320);
    }
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
              (&local_2e8,(value_type *)&local_320);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1c0);
    std::ios_base::~ios_base(local_140);
    Imf_3_4::Header::~Header((Header *)&local_320);
    iVar18 = iVar18 + 1;
  } while (iVar18 != 3);
  remove(local_248._M_dataplus._M_p);
  _Var7._M_p = local_248._M_dataplus._M_p;
  pHVar6 = local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar5 = local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar18 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)local_1c0,_Var7._M_p,pHVar5,
             (int)((ulong)((long)pHVar6 - (long)pHVar5) >> 3) * -0x49249249,false,iVar18);
  Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_1c0);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector(&local_298,&local_2e8);
  pcVar11 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)local_1c0,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  piVar12 = (int *)Imf_3_4::Header::displayWindow();
  iVar18 = (piVar12[3] - piVar12[1]) + 10;
  iVar8 = (piVar12[2] - *piVar12) + 10;
  if (piVar12[3] < piVar12[1] || piVar12[2] < *piVar12) {
    iVar18 = 10;
    iVar8 = 10;
  }
  local_320._M_dataplus._M_p = (pointer)0x0;
  Imf_3_4::Header::Header
            ((Header *)local_1c0,iVar8,iVar18,1.0,(Vec2 *)&local_320,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  Imf_3_4::Header::type_abi_cxx11_();
  Imf_3_4::Header::setType((string *)local_1c0);
  __x = (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
         *)Imf_3_4::Header::channels();
  this = (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
          *)Imf_3_4::Header::channels();
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  ::operator=(this,__x);
  puVar13 = (ulong *)Imf_3_4::Header::name_abi_cxx11_();
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2d0.field_2._8_2_ = 0x7265;
  local_2d0._M_string_length = 10;
  local_2d0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,*puVar13);
  paVar1 = &local_320.field_2;
  local_320._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar17) {
    local_320.field_2._M_allocated_capacity = *psVar17;
    local_320.field_2._8_8_ = plVar14[3];
    local_320._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar17;
  }
  local_320._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_4::Header::setName((string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_298,(value_type *)local_1c0);
  local_2d0._M_dataplus._M_p = (pointer)0x3c;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  local_320._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2d0);
  local_320.field_2._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
  builtin_strncpy(local_320._M_dataplus._M_p,
                  "Shared Attributes : displayWindow : should fail for !=values",0x3c);
  local_320._M_string_length = (size_type)local_2d0._M_dataplus._M_p;
  local_320._M_dataplus._M_p[(long)local_2d0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_298,&local_248,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  Imf_3_4::Header::~Header((Header *)local_1c0);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&local_298);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector(&local_298,&local_2e8);
  piVar12 = (int *)Imf_3_4::Header::displayWindow();
  iVar18 = (piVar12[2] - *piVar12) + 1;
  if (piVar12[3] < piVar12[1]) {
    iVar18 = 1;
  }
  if (piVar12[2] < *piVar12) {
    iVar18 = 1;
  }
  piVar12 = (int *)Imf_3_4::Header::displayWindow();
  local_26c = piVar12[2];
  iVar9 = *piVar12;
  iVar2 = piVar12[1];
  iVar3 = piVar12[3];
  pfVar15 = (float *)Imf_3_4::Header::pixelAspectRatio();
  iVar8 = (iVar3 - iVar2) + 1;
  if (iVar3 < iVar2) {
    iVar8 = 1;
  }
  if (local_26c < iVar9) {
    iVar8 = 1;
  }
  local_320._M_dataplus._M_p = (pointer)0x0;
  Imf_3_4::Header::Header
            ((Header *)local_1c0,iVar18,iVar8,*pfVar15 + 1.0,(Vec2 *)&local_320,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  Imf_3_4::Header::type_abi_cxx11_();
  Imf_3_4::Header::setType((string *)local_1c0);
  puVar13 = (ulong *)Imf_3_4::Header::name_abi_cxx11_();
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2d0.field_2._8_2_ = 0x7265;
  local_2d0._M_string_length = 10;
  local_2d0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,*puVar13);
  local_320._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar17) {
    local_320.field_2._M_allocated_capacity = *psVar17;
    local_320.field_2._8_8_ = plVar14[3];
    local_320._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar17;
  }
  local_320._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_4::Header::setName((string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_320,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_298,(value_type *)local_1c0);
  local_2d0._M_dataplus._M_p = (pointer)0x3e;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  local_320._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2d0);
  local_320.field_2._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
  builtin_strncpy(local_320._M_dataplus._M_p,
                  "Shared Attributes : pixelAspecRatio : should fail for !=values",0x3e);
  local_320._M_string_length = (size_type)local_2d0._M_dataplus._M_p;
  local_320._M_dataplus._M_p[(long)local_2d0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_298,&local_248,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  Imf_3_4::Header::~Header((Header *)local_1c0);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&local_298);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector(&local_298,&local_2e8);
  Imf_3_4::Header::Header
            ((Header *)local_1c0,
             local_298.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  puVar13 = (ulong *)Imf_3_4::Header::name_abi_cxx11_();
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2d0.field_2._8_2_ = 0x7265;
  local_2d0._M_string_length = 10;
  local_2d0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,*puVar13);
  local_320._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar17) {
    local_320.field_2._M_allocated_capacity = *psVar17;
    local_320.field_2._8_8_ = plVar14[3];
    local_320._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar17;
  }
  local_320._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_4::Header::setName((string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_320,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  Imf_3_4::TimeCode::TimeCode((TimeCode *)local_228,0x12d687,0,TV60_PACKING);
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::TypedAttribute((TimeCode *)local_208);
  pAVar16 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::staticTypeName();
  Imf_3_4::Header::insert((char *)local_1c0,pAVar16);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_298,(value_type *)local_1c0);
  local_2d0._M_dataplus._M_p = (pointer)0x38;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  local_320._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2d0);
  local_320.field_2._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
  builtin_strncpy(local_320._M_dataplus._M_p,
                  "Shared Attributes : timecode : should fail for !presence",0x38);
  local_320._M_string_length = (size_type)local_2d0._M_dataplus._M_p;
  local_320._M_dataplus._M_p[(long)local_2d0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_298,&local_248,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_298.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_298.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      pHVar5 = local_298.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pAVar16 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::staticTypeName();
      Imf_3_4::Header::insert((char *)(pHVar5 + lVar20),pAVar16);
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x38;
    } while (uVar19 < (ulong)(((long)local_298.
                                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_298.
                                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  iVar18 = Imf_3_4::TimeCode::timeAndFlags((Packing)local_228);
  Imf_3_4::TimeCode::setTimeAndFlags((uint)local_228,iVar18 + TV50_PACKING);
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::TypedAttribute((TimeCode *)&local_268);
  pAVar16 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::staticTypeName();
  Imf_3_4::Header::insert((char *)local_1c0,pAVar16);
  puVar13 = (ulong *)Imf_3_4::Header::name_abi_cxx11_();
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity._0_4_ = 0x312b5f;
  local_2d0._M_string_length = 3;
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,*puVar13);
  local_320._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar17) {
    local_320.field_2._M_allocated_capacity = *psVar17;
    local_320.field_2._8_8_ = plVar14[3];
    local_320._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar17;
  }
  local_320._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_4::Header::setName((string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_298,(value_type *)local_1c0);
  local_2d0._M_dataplus._M_p = (pointer)0x38;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  local_320._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)&local_2d0);
  local_320.field_2._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
  builtin_strncpy(local_320._M_dataplus._M_p,
                  "Shared Attributes : timecode : should fail for != values",0x38);
  local_320._M_string_length = (size_type)local_2d0._M_dataplus._M_p;
  local_320._M_dataplus._M_p[(long)local_2d0._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_298,&local_248,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::TimeCode> *)&local_268);
  Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::TimeCode> *)local_208);
  Imf_3_4::Header::~Header((Header *)local_1c0);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&local_298);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector(&local_268,&local_2e8);
  Imf_3_4::Header::Header
            ((Header *)local_1c0,
             local_268.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  puVar13 = (ulong *)Imf_3_4::Header::name_abi_cxx11_();
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity = 0x6461654877656e5f;
  local_2d0.field_2._8_2_ = 0x7265;
  local_2d0._M_string_length = 10;
  local_2d0.field_2._M_local_buf[10] = '\0';
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,*puVar13);
  local_320._M_dataplus._M_p = (pointer)*plVar14;
  psVar17 = (size_type *)(plVar14 + 2);
  if ((size_type *)local_320._M_dataplus._M_p == psVar17) {
    local_320.field_2._M_allocated_capacity = *psVar17;
    local_320.field_2._8_8_ = plVar14[3];
    local_320._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar17;
  }
  local_320._M_string_length = plVar14[1];
  *plVar14 = (long)psVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  Imf_3_4::Header::setName((string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_320,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  local_320._M_dataplus._M_p = (pointer)0x3ea8f5c33f23d70a;
  local_2d0._M_dataplus._M_p = (pointer)0x3f19999a3e99999a;
  local_208[0]._M_dataplus._M_p = (pointer)0x3d75c28f3e19999a;
  local_228[0] = 0x3ea872b03ea01a37;
  Imf_3_4::Chromaticities::Chromaticities
            ((Chromaticities *)&local_298,(Vec2 *)&local_320,(Vec2 *)&local_2d0,(Vec2 *)local_208,
             (Vec2 *)local_228);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute((Chromaticities *)&local_320);
  pAVar16 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::staticTypeName();
  Imf_3_4::Header::insert((char *)local_1c0,pAVar16);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_268,(value_type *)local_1c0);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_208[0]._M_dataplus._M_p = (pointer)0x3d;
  local_2d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2d0,(ulong)local_208);
  local_2d0.field_2._M_allocated_capacity = (size_type)local_208[0]._M_dataplus._M_p;
  builtin_strncpy(local_2d0._M_dataplus._M_p,
                  "Shared Attributes : chromaticities : should fail for !present",0x3d);
  local_2d0._M_string_length = (size_type)local_208[0]._M_dataplus._M_p;
  local_2d0._M_dataplus._M_p[(long)local_208[0]._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_268,&local_248,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_268.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_268.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      pHVar5 = local_268.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pAVar16 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::staticTypeName();
      Imf_3_4::Header::insert((char *)(pHVar5 + lVar20),pAVar16);
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x38;
    } while (uVar19 < (ulong)(((long)local_268.
                                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_268.
                                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  local_298.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44((float)((ulong)local_298.
                                        super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 0x20) + 1.0,
                         SUB84(local_298.
                               super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                               ._M_impl.super__Vector_impl_data._M_start,0) + 1.0);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute((Chromaticities *)&local_2d0);
  pAVar16 = (Attribute *)Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::staticTypeName();
  Imf_3_4::Header::insert((char *)local_1c0,pAVar16);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_268,(value_type *)local_1c0);
  local_228[0] = 0x3e;
  local_208[0]._M_dataplus._M_p = (pointer)&local_208[0].field_2;
  local_208[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_208,(ulong)local_228);
  local_208[0].field_2._M_allocated_capacity = local_228[0];
  builtin_strncpy(local_208[0]._M_dataplus._M_p,
                  "Shared Attributes : chromaticities : should fail for != values",0x3e);
  local_208[0]._M_string_length = local_228[0];
  local_208[0]._M_dataplus._M_p[local_228[0]] = '\0';
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_268,&local_248,local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208[0]._M_dataplus._M_p != &local_208[0].field_2) {
    operator_delete(local_208[0]._M_dataplus._M_p,local_208[0].field_2._M_allocated_capacity + 1);
  }
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Chromaticities> *)&local_2d0);
  Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
            ((TypedAttribute<Imf_3_4::Chromaticities> *)&local_320);
  Imf_3_4::Header::~Header((Header *)local_1c0);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&local_268);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&local_2e8);
  local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0[0]._M_dataplus._M_p = (pointer)&local_1c0[0].field_2;
  local_320._M_dataplus._M_p = (pointer)0x21;
  local_1c0[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_1c0,(ulong)&local_320);
  local_1c0[0].field_2._M_allocated_capacity = local_320._M_dataplus._M_p;
  builtin_strncpy(local_1c0[0]._M_dataplus._M_p,"Header : empty header list passed",0x21);
  local_1c0[0]._M_string_length = (size_type)local_320._M_dataplus._M_p;
  local_1c0[0]._M_dataplus._M_p[(long)local_320._M_dataplus._M_p] = '\0';
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_2e8,&local_248,local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
    operator_delete(local_1c0[0]._M_dataplus._M_p,
                    (ulong)(local_1c0[0].field_2._M_allocated_capacity + 1));
  }
  local_1c0[0]._M_dataplus._M_p = (pointer)0x0;
  Imf_3_4::Header::Header
            ((Header *)&local_320,0x40,0x40,1.0,(Vec2 *)local_1c0,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar11 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)local_1c0,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar11,(Channel *)"Dummy");
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_2e8,(value_type *)&local_320);
  local_1c0[0]._M_dataplus._M_p = (pointer)&local_1c0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"Header : empty image type passed","");
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_2e8,&local_248,local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
    operator_delete(local_1c0[0]._M_dataplus._M_p,
                    (ulong)(local_1c0[0].field_2._M_allocated_capacity + 1));
  }
  Imf_3_4::Header::setType
            ((string *)
             local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  Imf_3_4::Header::Header
            ((Header *)&local_2d0,
             local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
            (&local_2e8,(value_type *)&local_2d0);
  local_1c0[0]._M_dataplus._M_p = (pointer)&local_1c0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"Header: duplicate header names passed","");
  anon_unknown.dwarf_21a545::testMultiPartOutputFileForExpectedFailure
            (&local_2e8,&local_248,local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
    operator_delete(local_1c0[0]._M_dataplus._M_p,
                    (ulong)(local_1c0[0].field_2._M_allocated_capacity + 1));
  }
  pHVar5 = local_2e8.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1c0[0]._M_dataplus._M_p = (pointer)&local_1c0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"invalid image type","");
  Imf_3_4::Header::setType((string *)pHVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0[0]._M_dataplus._M_p != &local_1c0[0].field_2) {
    operator_delete(local_1c0[0]._M_dataplus._M_p,
                    (ulong)(local_1c0[0].field_2._M_allocated_capacity + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Header : unsupported image type passed",0x26);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartSharedAttributes.cpp"
                ,0x15e,"void (anonymous namespace)::testHeaders(const std::string &)");
}

Assistant:

void
testMultiPartSharedAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing multi part APIs : shared attributes, header... "
             << endl;

        random_reseed (1);

        std::string fn = tempDir + "imf_test_multipart_shared_attrs.exr";

        testSharedAttributes (fn);
        testHeaders (fn);

        cout << " ... ok\n" << endl;
    }
    catch (const IEX_NAMESPACE::BaseExc& e)
    {
        cerr << "ERROR -- caught IEX_NAMESPACE::BaseExc exception: "
             << e.what () << endl;
        assert (false);
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught std::exception exception: " << e.what ()
             << endl;
        assert (false);
    }
}